

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.h
# Opt level: O0

string * cppcms::filters::streamable::to_string<char>(ios *out,void *ptr)

{
  char *in_RDX;
  string *in_RDI;
  ostringstream oss;
  char *object;
  long local_198 [47];
  char *local_20;
  
  local_20 = in_RDX;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::ios::copyfmt((ios *)((long)local_198 + *(long *)(local_198[0] + -0x18)));
  std::operator<<((ostream *)local_198,*local_20);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return in_RDI;
}

Assistant:

static std::string to_string(std::ios &out,void const *ptr)
			{
				T const *object=reinterpret_cast<T const *>(ptr);
				std::ostringstream oss;
				oss.copyfmt(out);
				oss << *object;
				return oss.str();
			}